

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O0

void vdpu383_av1d_rcb_setup(Av1dHalCtx *p_hal,DXVA_PicParams_AV1 *dxva)

{
  RK_S32 RVar1;
  MppBuffer local_38;
  MppBuffer rcb_buf;
  uint local_28;
  RK_U32 i;
  RK_U32 max_cnt;
  RK_U32 offset;
  Vdpu383Av1dRegCtx *reg_ctx;
  DXVA_PicParams_AV1 *dxva_local;
  Av1dHalCtx *p_hal_local;
  
  _max_cnt = p_hal->reg_ctx;
  i = 0;
  local_28 = 1;
  if (p_hal->fast_mode != 0) {
    local_28 = 3;
  }
  reg_ctx = (Vdpu383Av1dRegCtx *)dxva;
  dxva_local = (DXVA_PicParams_AV1 *)p_hal;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0x8c,0,
                             (int)(((long)(int)(dxva->width + 7) & 0xfffffffffffffff8U) / 8) * 100,0
                            );
  i = RVar1 + i;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0x8e,i,
                             (int)(((long)(int)(*(ushort *)((long)&reg_ctx->regs + 2) + 7) &
                                   0xfffffffffffffff8U) / 8) * 100,1);
  i = RVar1 + i;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0x90,i,
                             (int)(((long)(int)(*(ushort *)((long)&reg_ctx->regs + 2) + 0x3f) &
                                   0xffffffffffffffc0U) / 0x40) * 0xac0,2);
  i = RVar1 + i;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0x92,i,
                             (int)(((long)(int)(*(ushort *)((long)&reg_ctx->regs + 2) + 0x3f) &
                                   0xffffffffffffffc0U) / 0x40) * 0xac0,3);
  i = RVar1 + i;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0x94,i,
                             (*(ushort *)((long)&reg_ctx->regs + 2) + 0x1ff & 0xfffffe00) * 0x24,4);
  i = RVar1 + i;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0x96,i,
                             (*(ushort *)((long)&reg_ctx->regs + 2) + 0x1ff & 0xfffffe00) * 0x24,5);
  i = RVar1 + i;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0x98,i,
                             (*(ushort *)((long)&reg_ctx->regs + 2) + 0x3f & 0xffffffc0) * 0x220,6);
  i = RVar1 + i;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0x9a,i,
                             (*(ushort *)((long)&reg_ctx->regs + 2) + 0x3f & 0xffffffc0) * 0x220,7);
  i = RVar1 + i;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0x9c,i,
                             (*(ushort *)((long)&reg_ctx->regs + 2) + 0x3f & 0xffffffc0) * 0x220,8);
  i = RVar1 + i;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0x9e,i,
                             (*(ushort *)((long)&reg_ctx->regs + 2) + 0x3f & 0xffffffc0) * 0x7d6,9);
  i = RVar1 + i;
  RVar1 = update_size_offset((Vdpu383RcbInfo *)((long)_max_cnt + 100),0xa0,i,
                             (*(ushort *)((long)&reg_ctx->regs + 2) + 0x3f & 0xffffffc0) * 0xdc,10);
  i = RVar1 + i;
  *(RK_U32 *)((long)_max_cnt + 0xe8) = i;
  av1d_refine_rcb_size
            ((Vdpu383RcbInfo *)((long)_max_cnt + 100),(uint)*(ushort *)((long)&reg_ctx->regs + 2),
             (uint)*(ushort *)((long)&reg_ctx->regs + 4),reg_ctx);
  for (rcb_buf._4_4_ = 0; rcb_buf._4_4_ < local_28; rcb_buf._4_4_ = rcb_buf._4_4_ + 1) {
    local_38 = *(MppBuffer *)((long)_max_cnt + (ulong)rcb_buf._4_4_ * 8 + 0xf0);
    if (local_38 != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(local_38,"vdpu383_av1d_rcb_setup");
      *(undefined8 *)((long)_max_cnt + (ulong)rcb_buf._4_4_ * 8 + 0xf0) = 0;
    }
    mpp_buffer_get_with_tag
              (*(MppBufferGroup *)((dxva_local->tiles).widths + 0xb),&local_38,
               (ulong)*(uint *)((long)_max_cnt + 0xe8),"hal_av1d_vdpu383","vdpu383_av1d_rcb_setup");
    *(MppBuffer *)((long)_max_cnt + (ulong)rcb_buf._4_4_ * 8 + 0xf0) = local_38;
  }
  return;
}

Assistant:

static void vdpu383_av1d_rcb_setup(Av1dHalCtx *p_hal, DXVA_PicParams_AV1 *dxva)
{
    Vdpu383Av1dRegCtx *reg_ctx = (Vdpu383Av1dRegCtx *)p_hal->reg_ctx;
    RK_U32 offset = 0;
    RK_U32 max_cnt = p_hal->fast_mode ? VDPU_FAST_REG_SET_CNT : 1;
    RK_U32 i;

    offset += update_size_offset(reg_ctx->rcb_buf_info, 140, offset, VDPU383_RCB_STRMD_ROW_LEN,             RCB_STRMD_ROW          );
    offset += update_size_offset(reg_ctx->rcb_buf_info, 142, offset, VDPU383_RCB_STRMD_TILE_ROW_LEN,        RCB_STRMD_TILE_ROW     );
    offset += update_size_offset(reg_ctx->rcb_buf_info, 144, offset, VDPU383_RCB_INTER_ROW_LEN,             RCB_INTER_ROW          );
    offset += update_size_offset(reg_ctx->rcb_buf_info, 146, offset, VDPU383_RCB_INTER_TILE_ROW_LEN,        RCB_INTER_TILE_ROW     );
    offset += update_size_offset(reg_ctx->rcb_buf_info, 148, offset, VDPU383_RCB_INTRA_ROW_LEN,             RCB_INTRA_ROW          );
    offset += update_size_offset(reg_ctx->rcb_buf_info, 150, offset, VDPU383_RCB_INTRA_TILE_ROW_LEN,        RCB_INTRA_TILE_ROW     );
    offset += update_size_offset(reg_ctx->rcb_buf_info, 152, offset, VDPU383_RCB_FILTERD_ROW_LEN,           RCB_FILTERD_ROW        );
    offset += update_size_offset(reg_ctx->rcb_buf_info, 154, offset, VDPU383_RCB_FILTERD_PROTECT_ROW_LEN,   RCB_FILTERD_PROTECT_ROW);
    offset += update_size_offset(reg_ctx->rcb_buf_info, 156, offset, VDPU383_RCB_FILTERD_TILE_ROW_LEN,      RCB_FILTERD_TILE_ROW   );
    offset += update_size_offset(reg_ctx->rcb_buf_info, 158, offset, VDPU383_RCB_FILTERD_TILE_COL_LEN,      RCB_FILTERD_TILE_COL   );
    offset += update_size_offset(reg_ctx->rcb_buf_info, 160, offset, VDPU383_RCB_FILTERD_AV1_UP_TL_COL_LEN, RCB_FILTERD_AV1_UP_TILE_COL);
    reg_ctx->rcb_buf_size = offset;

    av1d_refine_rcb_size(reg_ctx->rcb_buf_info, dxva->width, dxva->height, dxva);

    for (i = 0; i < max_cnt; i++) {
        MppBuffer rcb_buf = reg_ctx->rcb_bufs[i];

        if (rcb_buf) {
            mpp_buffer_put(rcb_buf);
            reg_ctx->rcb_bufs[i] = NULL;
        }
        mpp_buffer_get(p_hal->buf_group, &rcb_buf, reg_ctx->rcb_buf_size);
        reg_ctx->rcb_bufs[i] = rcb_buf;

        // rcb_buf_set_edge(reg_ctx, rcb_buf);
        // rcb_buf_dump_edge(reg_ctx, rcb_buf);
    }

    return;
}